

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateFunctionDef
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *funcName)

{
  long lVar1;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  string *local_20;
  string *funcName_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_20 = funcName;
  funcName_local = (string *)this;
  this_local = (SparseTextureClampLookupColorTestCase *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::find((char *)funcName,0x2a5f8c9);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n"
               ,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "    <FUNCTION>(uni_in,\n               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n               retValue<COMPONENT_DEF>);\n"
               ,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateFunctionDef(std::string funcName)
{
	if (funcName.find("sparse", 0) != std::string::npos)
	{
		return std::string("    <FUNCTION>(uni_in,\n"
						   "               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n"
						   "               retValue<COMPONENT_DEF>);\n");
	}
	else
	{
		return std::string("    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n"
						   "                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n");
	}
}